

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

int peek(void)

{
  LexerState *pLVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  
  while( true ) {
    while( true ) {
      iVar2 = peekInternal('\0');
      pLVar1 = lexerState;
      if (lexerState->macroArgScanDistance != 0) {
        return iVar2;
      }
      lexerState->macroArgScanDistance = 1;
      if (iVar2 != 0x7b) break;
      if (pLVar1->disableInterpolation != false) {
        return 0x7b;
      }
      shiftChar();
      pcVar5 = readInterpolation(0);
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        beginExpansion(pcVar5,false,pcVar5);
      }
    }
    if (iVar2 != 0x5c) {
      return iVar2;
    }
    if (pLVar1->disableMacroArgs != false) break;
    pLVar1->macroArgScanDistance = 2;
    uVar3 = peekInternal('\x01');
    uVar4 = (uVar3 & 0xff) - 0x23;
    if (((0x1d < uVar4) || ((0x22000001U >> (uVar4 & 0x1f) & 1) == 0)) &&
       (9 < (byte)((char)uVar3 - 0x30U))) {
      return 0x5c;
    }
    shiftChar();
    shiftChar();
    pcVar5 = readMacroArg((char)uVar3);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      beginExpansion(pcVar5,uVar3 == 0x23,(char *)0x0);
      sVar6 = strlen(pcVar5);
      lexerState->macroArgScanDistance = lexerState->macroArgScanDistance + sVar6;
      return (int)*pcVar5;
    }
  }
  return 0x5c;
}

Assistant:

static int peek(void)
{
	int c = peekInternal(0);

	if (lexerState->macroArgScanDistance > 0)
		return c;

	lexerState->macroArgScanDistance++; // Do not consider again

	if (c == '\\' && !lexerState->disableMacroArgs) {
		// If character is a backslash, check for a macro arg
		lexerState->macroArgScanDistance++;
		c = peekInternal(1);
		if (isMacroChar(c)) {
			shiftChar();
			shiftChar();
			char const *str = readMacroArg(c);

			// If the macro arg is invalid or an empty string, it cannot be
			// expanded, so skip it and keep peeking.
			if (!str || !str[0])
				return peek();

			beginExpansion(str, c == '#', NULL);

			// Assuming macro args can't be recursive (I'll be damned if a way
			// is found...), then we mark the entire macro arg as scanned.
			lexerState->macroArgScanDistance += strlen(str);

			c = str[0];
		} else {
			c = '\\';
		}
	} else if (c == '{' && !lexerState->disableInterpolation) {
		// If character is an open brace, do symbol interpolation
		shiftChar();
		char const *str = readInterpolation(0);

		if (str && str[0])
			beginExpansion(str, false, str);
		return peek();
	}

	return c;
}